

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamCorePDF.hpp
# Opt level: O2

double TasDREAM::
       getDensity<(TasDREAM::TypeDistribution)1,(TasDREAM::TypeSamplingForm)0,double,double>
                 (double x,double params,double params_1)

{
  initializer_list<double> __l;
  allocator_type local_39;
  double local_38;
  double local_30;
  double local_28;
  vector<double,_std::allocator<double>_> ParameterArray;
  
  __l._M_len = 2;
  __l._M_array = &local_30;
  local_38 = x;
  local_30 = params;
  local_28 = params_1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &ParameterArray.super__Vector_base<double,_std::allocator<double>_>,__l,&local_39);
  local_38 = exp(((local_38 -
                  *ParameterArray.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start) * -0.5 *
                 (local_38 -
                 *ParameterArray.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start)) /
                 ParameterArray.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[1]);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&ParameterArray.super__Vector_base<double,_std::allocator<double>_>);
  return local_38;
}

Assistant:

double getDensity(double x, Params... params){
    std::vector<typename std::tuple_element<0, std::tuple<Params...>>::type> ParameterArray = {params...};
    if (form == regform){
        if (distribution == dist_gaussian){
            return std::exp(-0.5 * (x - ParameterArray[0]) * (x - ParameterArray[0]) / ParameterArray[1]);
        }else if (distribution == dist_exponential){
            return std::exp(-ParameterArray[1] * (x - ParameterArray[0]));
        }else if (distribution == dist_beta){
            return std::pow(x - ParameterArray[0], ParameterArray[2] - 1.0) * std::pow(ParameterArray[1] - x, ParameterArray[3] - 1.0);
        }else if (distribution == dist_gamma){
            return std::pow(x - ParameterArray[0], ParameterArray[1] - 1.0) * std::exp(- ParameterArray[2] * (x - ParameterArray[0]));
        }else{ // uniform
            return 1.0;
        }
    }else{
        if (distribution == dist_gaussian){
            return -0.5 * (x - ParameterArray[0]) * (x - ParameterArray[0]) / ParameterArray[1];
        }else if (distribution == dist_exponential){
            return -ParameterArray[1] * (x - ParameterArray[0]);
        }else if (distribution == dist_beta){
            return std::log(x - ParameterArray[0]) * (ParameterArray[2] - 1.0) + std::log(ParameterArray[1] - x) * (ParameterArray[3] - 1.0);
        }else if (distribution == dist_gamma){
            return std::log(x - ParameterArray[0]) * (ParameterArray[1] - 1.0) - ParameterArray[2] * (x - ParameterArray[0]);
        }else{ // uniform
            return 0.0;
        }
    }
}